

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O1

void __thiscall cursespp::AppLayout::~AppLayout(AppLayout *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__AppLayout_001a64b8;
  (this->super_LayoutBase).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__AppLayout_001a6738;
  (this->super_LayoutBase).super_Window.super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__AppLayout_001a6768;
  (this->super_LayoutBase).super_Window.super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__AppLayout_001a6790;
  (this->super_LayoutBase).super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__AppLayout_001a67b8;
  (this->super_LayoutBase).super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__AppLayout_001a6860;
  (this->super_LayoutBase).super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__AppLayout_001a6888;
  (this->super_LayoutBase).super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__AppLayout_001a68b0;
  (this->super_LayoutBase).super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__AppLayout_001a68e0;
  (this->super_has_slots<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__AppLayout_001a6910;
  p_Var1 = (this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->hotkey).super___shared_ptr<cursespp::TextLabel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->shortcuts).
           super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  sigslot::has_slots<sigslot::multi_threaded_local>::~has_slots
            (&this->super_has_slots<sigslot::multi_threaded_local>);
  LayoutBase::~LayoutBase(&this->super_LayoutBase);
  return;
}

Assistant:

AppLayout::~AppLayout() {
}